

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Preprocessor_macros.cpp
# Opt level: O0

bool slang::parsing::isSameTokenList(TokenList *left,TokenList *right)

{
  bool bVar1;
  size_type sVar2;
  size_type sVar3;
  iterator pTVar4;
  Token *local_30;
  iterator rit;
  iterator lit;
  TokenList *right_local;
  TokenList *left_local;
  
  sVar2 = nonstd::span_lite::span<slang::parsing::Token,_18446744073709551615UL>::size
                    (&left->super_span<slang::parsing::Token,_18446744073709551615UL>);
  sVar3 = nonstd::span_lite::span<slang::parsing::Token,_18446744073709551615UL>::size
                    (&right->super_span<slang::parsing::Token,_18446744073709551615UL>);
  if (sVar2 == sVar3) {
    rit = nonstd::span_lite::span<slang::parsing::Token,_18446744073709551615UL>::begin
                    (&left->super_span<slang::parsing::Token,_18446744073709551615UL>);
    local_30 = nonstd::span_lite::span<slang::parsing::Token,_18446744073709551615UL>::begin
                         (&right->super_span<slang::parsing::Token,_18446744073709551615UL>);
    for (; pTVar4 = nonstd::span_lite::span<slang::parsing::Token,_18446744073709551615UL>::end
                              (&left->super_span<slang::parsing::Token,_18446744073709551615UL>),
        rit != pTVar4; rit = rit + 1) {
      bVar1 = isSameToken(*rit,*local_30);
      if (!bVar1) {
        return false;
      }
      local_30 = local_30 + 1;
    }
    left_local._7_1_ = true;
  }
  else {
    left_local._7_1_ = false;
  }
  return left_local._7_1_;
}

Assistant:

static bool isSameTokenList(const TokenList& left, const TokenList& right) {
    if (left.size() != right.size())
        return false;

    for (auto lit = left.begin(), rit = right.begin(); lit != left.end(); lit++, rit++) {
        if (!isSameToken(*lit, *rit))
            return false;
    }
    return true;
}